

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::addJacobianBlock
          (MultipleShootingTranscription *this,size_t initRow,size_t initCol,
          SparsityStructure *sparsity)

{
  size_t sVar1;
  size_t sVar2;
  NonZero NVar3;
  
  sVar1 = SparsityStructure::size(sparsity);
  if (sVar1 != 0) {
    sVar1 = 0;
    do {
      sVar2 = this->m_jacobianNonZeros;
      NVar3 = SparsityStructure::operator[](sparsity,sVar1);
      addNonZero(this,&this->m_jacobianNZRows,sVar2,initRow + NVar3.row);
      sVar2 = this->m_jacobianNonZeros;
      NVar3 = SparsityStructure::operator[](sparsity,sVar1);
      addNonZero(this,&this->m_jacobianNZCols,sVar2,NVar3.col + initCol);
      this->m_jacobianNonZeros = this->m_jacobianNonZeros + 1;
      sVar1 = sVar1 + 1;
      sVar2 = SparsityStructure::size(sparsity);
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void addJacobianBlock(size_t initRow, size_t initCol, const SparsityStructure& sparsity){
                for (size_t i = 0; i < sparsity.size(); ++i) {
                    addNonZero(m_jacobianNZRows, m_jacobianNonZeros, initRow + sparsity[i].row);
                    addNonZero(m_jacobianNZCols, m_jacobianNonZeros, initCol + sparsity[i].col);
                    m_jacobianNonZeros++;
                }
            }